

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

void __thiscall
internalJSONNode::internalJSONNode(internalJSONNode *this,json_string *name_t,json_string *value_t)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  __type _Var4;
  bool bVar5;
  json_string *pjVar6;
  size_t *psVar7;
  jsonChildren *pjVar8;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  json_string local_50;
  
  this->_type = '\0';
  JSONWorker::FixString(&this->_name,name_t,&this->_name_encoded);
  this->_name_encoded = false;
  (this->_string)._M_dataplus._M_p = (pointer)&(this->_string).field_2;
  (this->_string)._M_string_length = 0;
  (this->_string).field_2._M_local_buf[0] = '\0';
  this->_string_encoded = false;
  (this->_value)._number = 0.0;
  this->refcount = 1;
  this->fetched = false;
  pjVar6 = jsonSingletonEMPTY_JSON_STRING::getValue_abi_cxx11_();
  std::__cxx11::string::string((string *)&this->_comment,(string *)pjVar6);
  this->Children = (jsonChildren *)0x0;
  psVar7 = getCtorCounter();
  *psVar7 = *psVar7 + 1;
  if (value_t->_M_string_length == 0) {
LAB_00116305:
    this->_type = '\0';
LAB_00116329:
    this->fetched = true;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->_string);
    pcVar3 = (value_t->_M_dataplus)._M_p;
    cVar1 = *pcVar3;
    cVar2 = pcVar3[value_t->_M_string_length - 1];
    if (cVar1 == '{') {
      if (cVar2 == '}') {
        this->_type = '\x05';
        pjVar8 = jsonChildren::newChildren();
LAB_00116351:
        this->Children = pjVar8;
LAB_0011636d:
        this->fetched = false;
        return;
      }
      std::__cxx11::string::string((string *)&local_50,"Missing }",(allocator *)&local_70);
LAB_00116450:
      pjVar6 = &local_50;
      JSONDebug::_JSON_FAIL(pjVar6);
    }
    else {
      if (cVar1 == 'F') {
LAB_0011630a:
        pjVar6 = jsonSingletonCONST_FALSE::getValue_abi_cxx11_();
        _Var4 = std::operator==(value_t,pjVar6);
        if (_Var4) {
          (this->_value)._bool = false;
          this->_type = '\x03';
          goto LAB_00116329;
        }
        pjVar6 = jsonSingletonERROR_UNKNOWN_LITERAL::getValue_abi_cxx11_();
        std::operator+(&local_70,pjVar6,value_t);
        std::__cxx11::string::string((string *)&local_50,local_70._M_dataplus._M_p,&local_71);
      }
      else if (cVar1 == 'N') {
LAB_001162ed:
        pjVar6 = jsonSingletonCONST_NULL::getValue_abi_cxx11_();
        _Var4 = std::operator==(value_t,pjVar6);
        if (_Var4) goto LAB_00116305;
        pjVar6 = jsonSingletonERROR_UNKNOWN_LITERAL::getValue_abi_cxx11_();
        std::operator+(&local_70,pjVar6,value_t);
        std::__cxx11::string::string((string *)&local_50,local_70._M_dataplus._M_p,&local_71);
      }
      else if (cVar1 == 'T') {
LAB_001162c5:
        pjVar6 = jsonSingletonCONST_TRUE::getValue_abi_cxx11_();
        _Var4 = std::operator==(value_t,pjVar6);
        if (_Var4) {
          (this->_value)._bool = true;
          this->_type = '\x03';
          this->fetched = true;
          return;
        }
        pjVar6 = jsonSingletonERROR_UNKNOWN_LITERAL::getValue_abi_cxx11_();
        std::operator+(&local_70,pjVar6,value_t);
        std::__cxx11::string::string((string *)&local_50,local_70._M_dataplus._M_p,&local_71);
      }
      else {
        if (cVar1 == '[') {
          if (cVar2 == ']') {
            this->_type = '\x04';
            pjVar8 = jsonChildren::newChildren();
            goto LAB_00116351;
          }
          std::__cxx11::string::string((string *)&local_50,"Missing ]",(allocator *)&local_70);
          goto LAB_00116450;
        }
        if (cVar1 == 'f') goto LAB_0011630a;
        if (cVar1 == 'n') goto LAB_001162ed;
        if (cVar1 == 't') goto LAB_001162c5;
        if (cVar1 == '\"') {
          if (cVar2 == '\"') {
            this->_type = '\x01';
            goto LAB_0011636d;
          }
          std::__cxx11::string::string
                    ((string *)&local_50,"Unterminated quote",(allocator *)&local_70);
          goto LAB_00116450;
        }
        bVar5 = NumberToString::isNumeric(value_t);
        if (bVar5) {
          this->_type = '\x02';
          goto LAB_0011636d;
        }
        pjVar6 = jsonSingletonERROR_UNKNOWN_LITERAL::getValue_abi_cxx11_();
        std::operator+(&local_70,pjVar6,value_t);
        std::__cxx11::string::string((string *)&local_50,local_70._M_dataplus._M_p,&local_71);
      }
      JSONDebug::_JSON_FAIL(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      pjVar6 = &local_70;
    }
    std::__cxx11::string::~string((string *)pjVar6);
    Nullify(this);
  }
  return;
}

Assistant:

internalJSONNode::internalJSONNode(const json_string & name_t, const json_string & value_t) json_nothrow : _type(), _name_encoded(), _name(JSONWorker::FixString(name_t, NAME_ENCODED)), _string(), _string_encoded(), _value()
    initializeMutex(0)
    initializeRefCount(1)
    initializeFetch(false)
    initializeComment(json_global(EMPTY_JSON_STRING))
    initializeChildren(0){

    LIBJSON_CTOR;

    #ifdef JSON_STRICT
	   JSON_ASSERT_SAFE(!value_t.empty(), JSON_TEXT("empty node"), Nullify(); return;);
    #else 
	   if (json_unlikely(value_t.empty())){
		  _type = JSON_NULL;
		  SetFetched(true);
		  return;
	   }
    #endif

    _string = value_t;

    const json_char firstchar = value_t[0];
    #if defined JSON_DEBUG || defined JSON_SAFE
	   const json_char lastchar = value_t[value_t.length() - 1];
    #endif

    switch (firstchar){
        case JSON_TEXT('\"'):  //a json_string literal, still escaped and with leading and trailing quotes
            JSON_ASSERT_SAFE(lastchar == JSON_TEXT('\"'), JSON_TEXT("Unterminated quote"), Nullify(); return;);
            _type = JSON_STRING;
			SetFetchedFalseOrDo(FetchString());
            break;
        case JSON_TEXT('{'):  //a child node, or set of children
            JSON_ASSERT_SAFE(lastchar == JSON_TEXT('}'), JSON_TEXT("Missing }"), Nullify(); return;);
            _type = JSON_NODE;
			CHILDREN = jsonChildren::newChildren();
			SetFetchedFalseOrDo(FetchNode());
            break;
        case JSON_TEXT('['):  //an array
            JSON_ASSERT_SAFE(lastchar == JSON_TEXT(']'), JSON_TEXT("Missing ]"), Nullify(); return;);
            _type = JSON_ARRAY;
			CHILDREN = jsonChildren::newChildren();
			SetFetchedFalseOrDo(FetchArray());
            break;
        LETTERCASE('t', 'T'):
            JSON_ASSERT_SAFE(value_t == json_global(CONST_TRUE), json_string(json_global(ERROR_UNKNOWN_LITERAL) + value_t).c_str(), Nullify(); return;);
            _value._bool = true;
            _type = JSON_BOOL;
			SetFetched(true);
            break;
        LETTERCASE('f', 'F'):
            JSON_ASSERT_SAFE(value_t == json_global(CONST_FALSE), json_string(json_global(ERROR_UNKNOWN_LITERAL) + value_t).c_str(), Nullify(); return;);
            _value._bool = false;
            _type = JSON_BOOL;
			SetFetched(true);
            break;
        LETTERCASE('n', 'N'):
            JSON_ASSERT_SAFE(value_t == json_global(CONST_NULL), json_string(json_global(ERROR_UNKNOWN_LITERAL) + value_t).c_str(), Nullify(); return;);
            _type = JSON_NULL;
			SetFetched(true);
            break;
        default:
            JSON_ASSERT_SAFE(NumberToString::isNumeric(value_t), json_string(json_global(ERROR_UNKNOWN_LITERAL) + value_t).c_str(), Nullify(); return;);
			_type = JSON_NUMBER;
			SetFetchedFalseOrDo(FetchNumber());
            break;
    }
}